

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall google::protobuf::Message::PrintDebugString(Message *this)

{
  undefined8 uVar1;
  string local_30;
  Message *local_10;
  Message *this_local;
  
  local_10 = this;
  DebugString_abi_cxx11_(&local_30,this);
  uVar1 = std::__cxx11::string::c_str();
  printf("%s",uVar1);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Message::PrintDebugString() const { printf("%s", DebugString().c_str()); }